

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

_Bool al_make_path_canonical(ALLEGRO_PATH *path)

{
  _AL_VECTOR *vec;
  ulong uVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  size_t sVar5;
  uint idx;
  bool bVar6;
  
  vec = &path->segments;
  if ((path->segments)._size == 0) {
    bVar6 = true;
  }
  else {
    idx = 0;
    do {
      puVar3 = (undefined8 *)_al_vector_ref(vec,idx);
      pcVar4 = al_cstr((ALLEGRO_USTR *)*puVar3);
      iVar2 = strcmp(pcVar4,".");
      if (iVar2 == 0) {
        al_remove_path_component(path,idx);
      }
      else {
        idx = idx + 1;
      }
      uVar1 = (path->segments)._size;
    } while (idx < uVar1);
    bVar6 = uVar1 == 0;
  }
  if (!bVar6) {
    puVar3 = (undefined8 *)_al_vector_ref(vec,0);
    sVar5 = al_ustr_size((ALLEGRO_USTR *)*puVar3);
    if (sVar5 == 0) {
      uVar1 = (path->segments)._size;
      while (1 < uVar1) {
        puVar3 = (undefined8 *)_al_vector_ref(vec,1);
        pcVar4 = al_cstr((ALLEGRO_USTR *)*puVar3);
        iVar2 = strcmp(pcVar4,"..");
        if (iVar2 != 0) {
          return true;
        }
        al_remove_path_component(path,1);
        uVar1 = (path->segments)._size;
      }
    }
  }
  return true;
}

Assistant:

bool al_make_path_canonical(ALLEGRO_PATH *path)
{
   unsigned i;
   ASSERT(path);

   for (i = 0; i < _al_vector_size(&path->segments); ) {
      if (strcmp(get_segment_cstr(path, i), ".") == 0)
         al_remove_path_component(path, i);
      else
         i++;
   }

   /* Remove leading '..'s on absolute paths. */
   if (_al_vector_size(&path->segments) >= 1 &&
      al_ustr_size(get_segment(path, 0)) == 0)
   {
      while (_al_vector_size(&path->segments) >= 2 &&
         strcmp(get_segment_cstr(path, 1), "..") == 0)
      {
         al_remove_path_component(path, 1);
      }
   }

   return true;
}